

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::isPageSizesMultiplication
          (SparseTextureCommitmentTestCase *this,GLint target,GLint level)

{
  bool bVar1;
  GLint depth;
  GLint height;
  GLint width;
  
  SparseTextureUtils::getTextureLevelSize(target,&this->mState,level,&width,&height,&depth);
  if (target == 0x8513) {
    depth = depth * 6;
  }
  if ((((int)((long)((ulong)(uint)((int)((long)width / 2) >> 0x1f) << 0x20 |
                    (long)width / 2 & 0xffffffffU) % (long)(this->mState).pageSizeX) == 0) &&
      (height % (this->mState).pageSizeY == 0)) && (depth % (this->mState).pageSizeZ == 0)) {
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SparseTextureCommitmentTestCase::isPageSizesMultiplication(GLint target, GLint level)
{
	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	GLint widthCommitted = width / 2;
	if ((widthCommitted % mState.pageSizeX) == 0 && (height % mState.pageSizeY) == 0 && (depth % mState.pageSizeZ) == 0)
	{
		return true;
	}

	return false;
}